

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O2

void __thiscall Assimp::Blender::SectionParser::Next(SectionParser *this)

{
  string *message;
  StreamReaderAny *pSVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  unsigned_long uVar6;
  Logger *this_00;
  DeadlyImportError *this_01;
  long lStack_50;
  char tmp [4];
  allocator<char> local_41;
  string local_40;
  
  StreamReader<true,_true>::SetCurrentPos
            (this->stream,(ulong)(this->current).start + (this->current).size);
  tmp[0] = StreamReader<true,_true>::Get<signed_char>(this->stream);
  cVar2 = StreamReader<true,_true>::Get<signed_char>(this->stream);
  tmp[1] = cVar2;
  cVar3 = StreamReader<true,_true>::Get<signed_char>(this->stream);
  tmp[2] = cVar3;
  tmp[3] = StreamReader<true,_true>::Get<signed_char>(this->stream);
  if (tmp[3] == '\0') {
    if (cVar3 == '\0') {
      lStack_50 = 2 - (ulong)(cVar2 == '\0');
    }
    else {
      lStack_50 = 3;
    }
  }
  else {
    lStack_50 = 4;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,tmp,tmp + lStack_50);
  message = &(this->current).id;
  ::std::__cxx11::string::operator=((string *)message,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  iVar4 = StreamReader<true,_true>::Get<int>(this->stream);
  (this->current).size = (long)iVar4;
  if (this->ptr64 == true) {
    uVar6 = StreamReader<true,_true>::Get<unsigned_long>(this->stream);
  }
  else {
    uVar5 = StreamReader<true,_true>::Get<unsigned_int>(this->stream);
    uVar6 = (unsigned_long)uVar5;
  }
  (this->current).address.val = uVar6;
  uVar5 = StreamReader<true,_true>::Get<int>(this->stream);
  (this->current).dna_index = uVar5;
  iVar4 = StreamReader<true,_true>::Get<int>(this->stream);
  (this->current).num = (long)iVar4;
  pSVar1 = this->stream;
  (this->current).start = *(int *)&pSVar1->current - *(int *)&pSVar1->buffer;
  if ((ulong)(uint)(*(int *)&pSVar1->limit - *(int *)&pSVar1->current) < (this->current).size) {
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"BLEND: invalid size of file block",&local_41);
    DeadlyImportError::DeadlyImportError(this_01,&local_40);
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = DefaultLogger::get();
  Logger::debug(this_00,message);
  return;
}

Assistant:

void SectionParser :: Next()
{
    stream.SetCurrentPos(current.start + current.size);

    const char tmp[] = {
        (const char)stream.GetI1(),
        (const char)stream.GetI1(),
        (const char)stream.GetI1(),
        (const char)stream.GetI1()
    };
    current.id = std::string(tmp,tmp[3]?4:tmp[2]?3:tmp[1]?2:1);

    current.size = stream.GetI4();
    current.address.val = ptr64 ? stream.GetU8() : stream.GetU4();

    current.dna_index = stream.GetI4();
    current.num = stream.GetI4();

    current.start = stream.GetCurrentPos();
    if (stream.GetRemainingSizeToLimit() < current.size) {
        throw DeadlyImportError("BLEND: invalid size of file block");
    }

#ifdef ASSIMP_BUILD_BLENDER_DEBUG
    ASSIMP_LOG_DEBUG(current.id);
#endif
}